

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentReadPixelsTest::iterate(MapPersistentReadPixelsTest *this)

{
  _Alloc_hider _Var1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar7;
  char *description;
  qpTestResult testResult;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  MoveMapOwner MVar24;
  Buffer buffer;
  Texture texture;
  Framebuffer framebuffer;
  MapOwner map;
  MapOwner tmp;
  GLubyte updated_texture_data [64];
  GLubyte initial_texture_data [64];
  Buffer local_2a0;
  Texture local_288;
  Framebuffer local_278;
  string local_268;
  MapOwner local_248;
  code *local_238;
  GLenum local_230;
  char local_228 [128];
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  cVar8 = '\0';
  cVar9 = '\x01';
  cVar10 = '\x02';
  cVar11 = '\x03';
  cVar12 = '\x04';
  cVar13 = '\x05';
  cVar14 = '\x06';
  cVar15 = '\a';
  cVar16 = '\b';
  cVar17 = '\t';
  cVar18 = '\n';
  cVar19 = '\v';
  cVar20 = '\f';
  cVar21 = '\r';
  cVar22 = '\x0e';
  cVar23 = '\x0f';
  lVar6 = 0;
  do {
    local_228[lVar6 + 0x40] = cVar8;
    local_228[lVar6 + 0x41] = cVar9;
    local_228[lVar6 + 0x42] = cVar10;
    local_228[lVar6 + 0x43] = cVar11;
    local_228[lVar6 + 0x44] = cVar12;
    local_228[lVar6 + 0x45] = cVar13;
    local_228[lVar6 + 0x46] = cVar14;
    local_228[lVar6 + 0x47] = cVar15;
    local_228[lVar6 + 0x48] = cVar16;
    local_228[lVar6 + 0x49] = cVar17;
    local_228[lVar6 + 0x4a] = cVar18;
    local_228[lVar6 + 0x4b] = cVar19;
    local_228[lVar6 + 0x4c] = cVar20;
    local_228[lVar6 + 0x4d] = cVar21;
    local_228[lVar6 + 0x4e] = cVar22;
    local_228[lVar6 + 0x4f] = cVar23;
    local_228[lVar6] = '@' - cVar8;
    local_228[lVar6 + 1] = '@' - cVar9;
    local_228[lVar6 + 2] = '@' - cVar10;
    local_228[lVar6 + 3] = '@' - cVar11;
    local_228[lVar6 + 4] = '@' - cVar12;
    local_228[lVar6 + 5] = '@' - cVar13;
    local_228[lVar6 + 6] = '@' - cVar14;
    local_228[lVar6 + 7] = '@' - cVar15;
    local_228[lVar6 + 8] = '@' - cVar16;
    local_228[lVar6 + 9] = '@' - cVar17;
    local_228[lVar6 + 10] = '@' - cVar18;
    local_228[lVar6 + 0xb] = '@' - cVar19;
    local_228[lVar6 + 0xc] = '@' - cVar20;
    local_228[lVar6 + 0xd] = '@' - cVar21;
    local_228[lVar6 + 0xe] = '@' - cVar22;
    local_228[lVar6 + 0xf] = '@' - cVar23;
    lVar6 = lVar6 + 0x10;
    cVar8 = cVar8 + '\x10';
    cVar9 = cVar9 + '\x10';
    cVar10 = cVar10 + '\x10';
    cVar11 = cVar11 + '\x10';
    cVar12 = cVar12 + '\x10';
    cVar13 = cVar13 + '\x10';
    cVar14 = cVar14 + '\x10';
    cVar15 = cVar15 + '\x10';
    cVar16 = cVar16 + '\x10';
    cVar17 = cVar17 + '\x10';
    cVar18 = cVar18 + '\x10';
    cVar19 = cVar19 + '\x10';
    cVar20 = cVar20 + '\x10';
    cVar21 = cVar21 + '\x10';
    cVar22 = cVar22 + '\x10';
    cVar23 = cVar23 + '\x10';
  } while (lVar6 != 0x40);
  local_2a0.m_context = (this->super_TestCase).m_context;
  local_2a0.m_id = 0xffffffff;
  local_2a0.m_target = 0x8892;
  local_278.m_id = 0xffffffff;
  local_288.m_id = 0xffffffff;
  local_288.m_context = local_2a0.m_context;
  local_278.m_context = local_2a0.m_context;
  BufferStorage::Buffer::InitStorage(&local_2a0,0x88eb,0x43,0x40,(GLvoid *)0x0);
  BufferStorage::Texture::Generate(gl,&local_288.m_id);
  (*gl->bindTexture)(0xde1,local_288.m_id);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x52a);
  (*gl->texStorage2D)(0xde1,1,0x8232,8,8);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x5e4);
  (*gl->texSubImage2D)(0xde1,0,0,0,8,8,0x8d94,0x1401,local_228 + 0x40);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"TexSubImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x60e);
  BufferStorage::Framebuffer::Generate(gl,&local_278.m_id);
  (*gl->bindFramebuffer)(0x8ca8,local_278.m_id);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x3a0);
  BufferStorage::Framebuffer::AttachTexture(gl,0x8ca8,0x8ce0,local_288.m_id,8,8);
  iVar2 = (*(local_2a0.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x40))(local_2a0.m_target,local_2a0.m_id);
  dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (*gl->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"ReadPixels to not mapped PIXEL_PACK buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb2b);
  (*gl->texSubImage2D)(0xde1,0,0,0,8,8,0x8d94,0x1401,local_228);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"TexSubImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x60e);
  MVar24 = BufferStorage::Buffer::MapRange(&local_2a0,0,0x40,0x43);
  local_268._M_string_length = (size_type)MVar24.buffer;
  local_268._M_dataplus._M_p = (pointer)MVar24.data;
  iVar2 = (*(local_2a0.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x40))(local_2a0.m_target,local_2a0.m_id);
  dVar4 = (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (*gl->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"ReadPixels to persistently mapped PIXEL_PACK buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb42);
  (*gl->memoryBarrier)(0x4000);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb45);
  (*gl->finish)();
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb48);
  iVar2 = bcmp(local_228,MVar24.data,0x40);
  if (iVar2 != 0) {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "Wrong contents of persistently mapped PIXEL_PACK buffer after ReadPixels",0x48);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_268);
  MVar24 = BufferStorage::Buffer::MapRange(&local_2a0,0,0x40,3);
  local_248.m_data = MVar24.data;
  local_248.m_buffer = MVar24.buffer;
  iVar5 = (*(local_2a0.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar5) + 0x40))(local_2a0.m_target,local_2a0.m_id);
  dVar4 = (**(code **)(CONCAT44(extraout_var_02,iVar5) + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (*gl->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar3 = (*gl->getError)();
  if (GVar3 == 0x502) {
    BufferStorage::Buffer::MapOwner::~MapOwner(&local_248);
    if (iVar2 == 0) {
      testResult = QP_TEST_RESULT_PASS;
      description = "Pass";
      goto LAB_0086a94a;
    }
  }
  else {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "Wrong error was generated by ReadPixels. Expected INVALID_OPERATION as PIXEL_PACK buffer is mapped. Got: "
               ,0x69);
    local_238 = glu::getErrorName;
    local_230 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_238);
    _Var1._M_p = local_268._M_dataplus._M_p;
    if (local_268._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
    }
    else {
      sVar7 = strlen(local_268._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,_Var1._M_p,sVar7);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
    BufferStorage::Buffer::MapOwner::~MapOwner(&local_248);
  }
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_0086a94a:
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,testResult,description);
  BufferStorage::Texture::~Texture(&local_288);
  BufferStorage::Framebuffer::~Framebuffer(&local_278);
  BufferStorage::Buffer::~Buffer(&local_2a0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentReadPixelsTest::iterate()
{
	static const GLuint height	= 8;
	static const GLuint width	 = 8;
	static const size_t data_size = width * height;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLubyte initial_texture_data[data_size];
	GLubyte updated_texture_data[data_size];

	for (size_t i = 0; i < data_size; ++i)
	{
		initial_texture_data[i] = (glw::GLubyte)i;
		updated_texture_data[i] = (glw::GLubyte)(data_size - i);
	}

	/* Prepare GL objects */
	Buffer		buffer(m_context);
	Framebuffer framebuffer(m_context);
	Texture		texture(m_context);

	buffer.InitStorage(GL_PIXEL_PACK_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, data_size,
					   0 /* data */);

	Texture::Generate(gl, texture.m_id);
	Texture::Bind(gl, texture.m_id, GL_TEXTURE_2D);
	Texture::Storage(gl, GL_TEXTURE_2D, 1 /* levels */, GL_R8UI, width, height, 0 /* depth */);
	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, initial_texture_data);

	Framebuffer::Generate(gl, framebuffer.m_id);
	Framebuffer::Bind(gl, GL_READ_FRAMEBUFFER, framebuffer.m_id);
	Framebuffer::AttachTexture(gl, GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture.m_id, width, height);

	/*
	 * - execute ReadPixels to transfer texture contents to buffer, no error should
	 * be generated;
	 */
	buffer.Bind();
	gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
				  0 /* offset in PIXEL_PACK_BUFFER */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels to not mapped PIXEL_PACK buffer");

	/*
	 * - update contents of texture with different image;
	 * - map buffer contents with MapBufferRange, <access> should contain
	 * MAP_PERSISTENT_BIT, MAP_READ_BIT and MAP_WRITE_BIT;
	 * - execute ReadPixels to transfer texture contents to buffer, no error should
	 * be generated;
	 * - execute MemoryBarrier with CLIENT_MAPPED_BUFFER_BARRIER_BIT and Finish;
	 * - inspect contents of mapped buffer, to verify that latest data transfer was
	 * successful;
	 * - unmap buffer
	 */
	{
		Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height,
						  0 /* depth */, GL_RED_INTEGER, GL_UNSIGNED_BYTE, updated_texture_data);

		const Buffer::MapOwner map(
			buffer.MapRange(0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		buffer.Bind();
		gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
					  0 /* offset in PIXEL_PACK_BUFFER */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels to persistently mapped PIXEL_PACK buffer");

		gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(updated_texture_data, map.m_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong contents of persistently mapped PIXEL_PACK buffer after ReadPixels"
				<< tcu::TestLog::EndMessage;
		}
	}

	/*
	 * - map buffer contents again, this time do not provide MAP_PERSISTENT_BIT;
	 * - execute ReadPixels to transfer texture contents to buffer,
	 * INVALID_OPERATION error should be generated.
	 */
	{
		Buffer::MapOwner tmp(buffer.MapRange(0 /* offset */, data_size, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		buffer.Bind();
		gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
					  0 /* offset in PIXEL_PACK_BUFFER */);
		GLenum error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong error was generated by ReadPixels. Expected INVALID_OPERATION as "
											"PIXEL_PACK buffer is mapped. Got: "
				<< glu::getErrorStr(error).toString().c_str() << tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}